

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::RealisticCamera::DrawLensSystem(RealisticCamera *this)

{
  size_t sVar1;
  const_reference args_5;
  const_reference pvVar2;
  float *pfVar3;
  int iVar4;
  char (*in_RDI) [25];
  Float FVar6;
  float fVar7;
  double dVar8;
  Float nextTheta;
  Float nextCurvatureRadius;
  Float zp1;
  Float zp0;
  Float hlow;
  Float h;
  Float nextApertureRadius;
  size_t vb;
  size_t va;
  Float t1_1;
  Float t0_1;
  Float t1;
  Float t0;
  Float theta;
  Float r;
  LensElementInterface *element;
  size_t i;
  Float z;
  Float sumz;
  undefined4 in_stack_ffffffffffffff60;
  Float FVar9;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  Float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float local_60;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float fVar10;
  float fVar11;
  ulong local_20;
  float local_18;
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *pvVar5;
  
  FVar6 = LensFrontZ((RealisticCamera *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_20 = 0;
  local_18 = -FVar6;
  do {
    sVar1 = pstd::
            vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                    *)(in_RDI[0x24] + 0xc));
    if (sVar1 <= local_20) {
      printf("Line[{{0, -.012}, {0, .012}}], ");
      printf("Line[{{0, 0}, {%f, 0}}] ",(double)(-FVar6 * 1.2));
      return;
    }
    pvVar5 = (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
              *)(in_RDI[0x24] + 0xc);
    args_5 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[](pvVar5,local_20);
    iVar4 = (int)pvVar5;
    fVar11 = args_5->curvatureRadius;
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      fVar7 = SafeASin(0.0);
      std::abs(iVar4);
      if (fVar11 <= 0.0) {
        in_stack_ffffffffffffffc4 = -fVar7;
        fVar10 = fVar7;
        printf("Circle[{%f, 0}, %f, {%f, %f}], ",(double)(local_18 + fVar11),(double)-fVar11,
               (double)in_stack_ffffffffffffffc4,(double)fVar7);
        in_stack_ffffffffffffffc0 = fVar7;
      }
      else {
        in_stack_ffffffffffffffcc = 3.1415927 - fVar7;
        in_stack_ffffffffffffffc8 = fVar7 + 3.1415927;
        printf("Circle[{%f, 0}, %f, {%f, %f}], ",(double)(local_18 + fVar11),(double)fVar11,
               (double)in_stack_ffffffffffffffcc,(double)in_stack_ffffffffffffffc8);
        fVar10 = fVar7;
      }
      if (((args_5->eta != 0.0) || (NAN(args_5->eta))) &&
         ((args_5->eta != 1.0 || (NAN(args_5->eta))))) {
        sVar1 = pstd::
                vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                        *)(in_RDI[0x24] + 0xc));
        if (sVar1 <= local_20 + 1) {
          LogFatal<char_const(&)[6],char_const(&)[25],char_const(&)[6],unsigned_long&,char_const(&)[25],unsigned_long&>
                    ((LogLevel)(sVar1 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (int)in_stack_ffffffffffffffa4,
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (char (*) [6])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_RDI,(char (*) [6])
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (unsigned_long *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (char (*) [25])CONCAT44(fVar11,fVar10),(unsigned_long *)args_5);
        }
        pvVar2 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI[0x24] + 0xc),local_20 + 1);
        FVar9 = pvVar2->apertureRadius;
        pfVar3 = std::max<float>(&args_5->apertureRadius,(float *)&stack0xffffffffffffffac);
        in_stack_ffffffffffffffa8 = *pfVar3;
        pfVar3 = std::min<float>(&args_5->apertureRadius,(float *)&stack0xffffffffffffffac);
        in_stack_ffffffffffffffa4 = *pfVar3;
        if (fVar11 <= 0.0) {
          fVar11 = args_5->curvatureRadius;
          fVar7 = args_5->apertureRadius;
          dVar8 = std::tan((double)(ulong)(uint)fVar10);
          local_60 = local_18 + fVar11 + fVar7 / SUB84(dVar8,0);
        }
        else {
          fVar11 = args_5->curvatureRadius;
          fVar7 = args_5->apertureRadius;
          dVar8 = std::tan((double)(ulong)(uint)fVar10);
          local_60 = (local_18 + fVar11) - fVar7 / SUB84(dVar8,0);
        }
        pvVar5 = (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                  *)(in_RDI[0x24] + 0xc);
        pvVar2 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[](pvVar5,local_20 + 1);
        iVar4 = (int)pvVar5;
        in_stack_ffffffffffffff98 = pvVar2->curvatureRadius;
        in_stack_ffffffffffffff94 = SafeASin(0.0);
        std::abs(iVar4);
        in_stack_ffffffffffffffac = FVar9;
        if (in_stack_ffffffffffffff98 <= 0.0) {
          in_stack_ffffffffffffff9c = local_18 + args_5->thickness + in_stack_ffffffffffffff98;
          dVar8 = std::tan((double)(ulong)(uint)in_stack_ffffffffffffff94);
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + FVar9 / SUB84(dVar8,0);
        }
        else {
          in_stack_ffffffffffffff9c = local_18 + args_5->thickness + in_stack_ffffffffffffff98;
          dVar8 = std::tan((double)(ulong)(uint)in_stack_ffffffffffffff94);
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c - FVar9 / SUB84(dVar8,0);
        }
        printf("Line[{{%f, %f}, {%f, %f}}], ",(double)local_60,(double)in_stack_ffffffffffffffa8,
               (double)in_stack_ffffffffffffff9c,(double)in_stack_ffffffffffffffa8);
        printf("Line[{{%f, %f}, {%f, %f}}], ",(double)local_60,(double)-in_stack_ffffffffffffffa8,
               (double)in_stack_ffffffffffffff9c,(double)-in_stack_ffffffffffffffa8);
        if (in_stack_ffffffffffffffac <= args_5->apertureRadius) {
          if (in_stack_ffffffffffffffac < args_5->apertureRadius) {
            printf("Line[{{%f, %f}, {%f, %f}}], ",(double)in_stack_ffffffffffffff9c,
                   (double)in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffff9c,
                   (double)in_stack_ffffffffffffffa4);
            printf("Line[{{%f, %f}, {%f, %f}}], ",(double)in_stack_ffffffffffffff9c,
                   (double)-in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffff9c,
                   (double)-in_stack_ffffffffffffffa4);
          }
        }
        else {
          printf("Line[{{%f, %f}, {%f, %f}}], ",(double)local_60,(double)in_stack_ffffffffffffffa8,
                 (double)local_60,(double)in_stack_ffffffffffffffa4);
          printf("Line[{{%f, %f}, {%f, %f}}], ",(double)local_60,(double)-in_stack_ffffffffffffffa8,
                 (double)local_60,(double)-in_stack_ffffffffffffffa4);
        }
      }
    }
    else {
      printf("{Thick, Line[{{%f, %f}, {%f, %f}}], ",(double)local_18,(double)args_5->apertureRadius,
             (double)local_18,(double)(args_5->apertureRadius * 2.0));
      printf("Line[{{%f, %f}, {%f, %f}}]}, ",(double)local_18,(double)-args_5->apertureRadius,
             (double)local_18,(double)(args_5->apertureRadius * -2.0));
    }
    local_18 = args_5->thickness + local_18;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void RealisticCamera::DrawLensSystem() const {
    Float sumz = -LensFrontZ();
    Float z = sumz;
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        Float r = element.curvatureRadius;
        if (r == 0) {
            // stop
            printf("{Thick, Line[{{%f, %f}, {%f, %f}}], ", z, element.apertureRadius, z,
                   2 * element.apertureRadius);
            printf("Line[{{%f, %f}, {%f, %f}}]}, ", z, -element.apertureRadius, z,
                   -2 * element.apertureRadius);
        } else {
            Float theta = std::abs(SafeASin(element.apertureRadius / r));
            if (r > 0) {
                // convex as seen from front of lens
                Float t0 = Pi - theta;
                Float t1 = Pi + theta;
                printf("Circle[{%f, 0}, %f, {%f, %f}], ", z + r, r, t0, t1);
            } else {
                // concave as seen from front of lens
                Float t0 = -theta;
                Float t1 = theta;
                printf("Circle[{%f, 0}, %f, {%f, %f}], ", z + r, -r, t0, t1);
            }
            if (element.eta != 0 && element.eta != 1) {
                // connect top/bottom to next element
                CHECK_LT(i + 1, elementInterfaces.size());
                Float nextApertureRadius = elementInterfaces[i + 1].apertureRadius;
                Float h = std::max(element.apertureRadius, nextApertureRadius);
                Float hlow = std::min(element.apertureRadius, nextApertureRadius);

                Float zp0, zp1;
                if (r > 0) {
                    zp0 = z + element.curvatureRadius -
                          element.apertureRadius / std::tan(theta);
                } else {
                    zp0 = z + element.curvatureRadius +
                          element.apertureRadius / std::tan(theta);
                }

                Float nextCurvatureRadius = elementInterfaces[i + 1].curvatureRadius;
                Float nextTheta =
                    std::abs(SafeASin(nextApertureRadius / nextCurvatureRadius));
                if (nextCurvatureRadius > 0) {
                    zp1 = z + element.thickness + nextCurvatureRadius -
                          nextApertureRadius / std::tan(nextTheta);
                } else {
                    zp1 = z + element.thickness + nextCurvatureRadius +
                          nextApertureRadius / std::tan(nextTheta);
                }

                // Connect tops
                printf("Line[{{%f, %f}, {%f, %f}}], ", zp0, h, zp1, h);
                printf("Line[{{%f, %f}, {%f, %f}}], ", zp0, -h, zp1, -h);

                // vertical lines when needed to close up the element profile
                if (element.apertureRadius < nextApertureRadius) {
                    printf("Line[{{%f, %f}, {%f, %f}}], ", zp0, h, zp0, hlow);
                    printf("Line[{{%f, %f}, {%f, %f}}], ", zp0, -h, zp0, -hlow);
                } else if (element.apertureRadius > nextApertureRadius) {
                    printf("Line[{{%f, %f}, {%f, %f}}], ", zp1, h, zp1, hlow);
                    printf("Line[{{%f, %f}, {%f, %f}}], ", zp1, -h, zp1, -hlow);
                }
            }
        }
        z += element.thickness;
    }

    // 24mm height for 35mm film
    printf("Line[{{0, -.012}, {0, .012}}], ");
    // optical axis
    printf("Line[{{0, 0}, {%f, 0}}] ", 1.2f * sumz);
}